

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O0

bool __thiscall gflags::anon_unknown_2::FlagValue::Equal(FlagValue *this,FlagValue *x)

{
  FlagValue *x_local;
  FlagValue *this_local;
  
  if (this->type_ == x->type_) {
    switch(this->type_) {
    case '\0':
      this_local._7_1_ = (*this->value_buffer_ & 1) == (*x->value_buffer_ & 1);
      break;
    case '\x01':
      this_local._7_1_ = *this->value_buffer_ == *x->value_buffer_;
      break;
    case '\x02':
      this_local._7_1_ = *this->value_buffer_ == *x->value_buffer_;
      break;
    case '\x03':
      this_local._7_1_ = *this->value_buffer_ == *x->value_buffer_;
      break;
    case '\x04':
      this_local._7_1_ = *this->value_buffer_ == *x->value_buffer_;
      break;
    case '\x05':
      this_local._7_1_ = *this->value_buffer_ == *x->value_buffer_;
      break;
    case '\x06':
      this_local._7_1_ =
           std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           this->value_buffer_,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           x->value_buffer_);
      break;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/jarulraj[P]sqlcheck/external/gflags/src/gflags.cc"
                    ,0x1c8,
                    "bool gflags::(anonymous namespace)::FlagValue::Equal(const FlagValue &) const")
      ;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool FlagValue::Equal(const FlagValue& x) const {
  if (type_ != x.type_)
    return false;
  switch (type_) {
    case FV_BOOL:   return VALUE_AS(bool) == OTHER_VALUE_AS(x, bool);
    case FV_INT32:  return VALUE_AS(int32) == OTHER_VALUE_AS(x, int32);
    case FV_UINT32: return VALUE_AS(uint32) == OTHER_VALUE_AS(x, uint32);
    case FV_INT64:  return VALUE_AS(int64) == OTHER_VALUE_AS(x, int64);
    case FV_UINT64: return VALUE_AS(uint64) == OTHER_VALUE_AS(x, uint64);
    case FV_DOUBLE: return VALUE_AS(double) == OTHER_VALUE_AS(x, double);
    case FV_STRING: return VALUE_AS(string) == OTHER_VALUE_AS(x, string);
    default: assert(false); return false;  // unknown type
  }
}